

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1112::run(TestCase1112 *this)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  Reader RVar5;
  DebugComparison<int,_unsigned_long> _kjCondition;
  char *local_150;
  char *local_148;
  BuilderFor<capnp::Text> builder;
  Orphan<capnp::Text> orphan;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  _kjCondition._0_16_ = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnp::Text>(&orphan,(Orphanage *)&_kjCondition,0x11);
  OrphanBuilder::asText(&builder,&orphan.builder);
  memset(builder.content.ptr,0x61,builder.content.size_ - 1);
  AVar4 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  sVar1 = (AVar4.ptr)->size_;
  _kjCondition.left = 4;
  _kjCondition.right = sVar1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = sVar1 == 4;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_148 = (char *)CONCAT44(local_148._4_4_,4);
    AVar4 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    local_150 = (char *)(AVar4.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x45e,ERROR,
               "\"failed: expected \" \"(4) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 4, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (4) == (message.getSegmentsForOutput()[0].size())",
               &_kjCondition,(int *)&local_148,(unsigned_long *)&local_150);
  }
  OrphanBuilder::truncateText(&orphan.builder,2);
  AVar4 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  sVar1 = (AVar4.ptr)->size_;
  _kjCondition.left = 2;
  _kjCondition.right = sVar1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = sVar1 == 2;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_148 = (char *)CONCAT44(local_148._4_4_,2);
    AVar4 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    local_150 = (char *)(AVar4.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x460,ERROR,
               "\"failed: expected \" \"(2) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 2, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (2) == (message.getSegmentsForOutput()[0].size())",
               &_kjCondition,(int *)&local_148,(unsigned_long *)&local_150);
  }
  RVar5 = OrphanBuilder::asTextReader(&orphan.builder);
  pcVar2 = RVar5.super_StringPtr.content.ptr;
  pcVar3 = (char *)(RVar5.super_StringPtr.content.size_ - 1);
  _kjCondition.result = pcVar3 == (char *)0x2;
  _kjCondition.left = 2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    local_148 = (char *)CONCAT44(local_148._4_4_,2);
    local_150 = pcVar3;
    _kjCondition.right = (unsigned_long)pcVar3;
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x463,ERROR,
               "\"failed: expected \" \"(2) == (reader.size())\", _kjCondition, 2, reader.size()",
               (char (*) [40])"failed: expected (2) == (reader.size())",&_kjCondition,
               (int *)&local_148,(unsigned_long *)&local_150);
  }
  _kjCondition.result = builder.content.ptr == pcVar2;
  _kjCondition.right = (unsigned_long)pcVar2;
  _kjCondition._0_8_ = builder.content.ptr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    local_150 = builder.content.ptr;
    local_148 = pcVar2;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char*,char_const*>&,char*,char_const*>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x464,ERROR,
               "\"failed: expected \" \"(builder.begin()) == (reader.begin())\", _kjCondition, builder.begin(), reader.begin()"
               ,(char (*) [55])"failed: expected (builder.begin()) == (reader.begin())",
               (DebugComparison<char_*,_const_char_*> *)&_kjCondition,&local_150,&local_148);
  }
  _kjCondition.result = *builder.content.ptr == 'a';
  _kjCondition.left._0_1_ = 0x61;
  _kjCondition.right = (unsigned_long)builder.content.ptr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    local_150 = (char *)CONCAT71(local_150._1_7_,0x61);
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<char,char&>&,char,char&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x466,ERROR,
               "\"failed: expected \" \"(\'a\') == (builder[0])\", _kjCondition, \'a\', builder[0]",
               (char (*) [39])"failed: expected (\'a\') == (builder[0])",
               (DebugComparison<char,_char_&> *)&_kjCondition,(char *)&local_150,builder.content.ptr
              );
  }
  _kjCondition.result = builder.content.ptr[1] == 'a';
  _kjCondition.left._0_1_ = 0x61;
  _kjCondition.right = (unsigned_long)(builder.content.ptr + 1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_150 = (char *)CONCAT71(local_150._1_7_,0x61);
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<char,char&>&,char,char&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x467,ERROR,
               "\"failed: expected \" \"(\'a\') == (builder[1])\", _kjCondition, \'a\', builder[1]",
               (char (*) [39])"failed: expected (\'a\') == (builder[1])",
               (DebugComparison<char,_char_&> *)&_kjCondition,(char *)&local_150,
               builder.content.ptr + 1);
  }
  _kjCondition.result = builder.content.ptr[2] == '\0';
  _kjCondition._0_8_ = _kjCondition._1_8_ << 8;
  _kjCondition.right = (unsigned_long)(builder.content.ptr + 2);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_150 = (char *)((ulong)local_150 & 0xffffffffffffff00);
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x468,ERROR,
               "\"failed: expected \" \"(\'\\\\0\') == (builder[2])\", _kjCondition, \'\\0\', builder[2]"
               ,(char (*) [40])"failed: expected (\'\\0\') == (builder[2])",
               (DebugComparison<char,_char_&> *)&_kjCondition,(char *)&local_150,
               builder.content.ptr + 2);
  }
  _kjCondition.result = builder.content.ptr[3] == '\0';
  _kjCondition._0_8_ = _kjCondition._1_8_ << 8;
  _kjCondition.right = (unsigned_long)(builder.content.ptr + 3);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_150 = (char *)((ulong)local_150 & 0xffffffffffffff00);
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x469,ERROR,
               "\"failed: expected \" \"(\'\\\\0\') == (builder[3])\", _kjCondition, \'\\0\', builder[3]"
               ,(char (*) [40])"failed: expected (\'\\0\') == (builder[3])",
               (DebugComparison<char,_char_&> *)&_kjCondition,(char *)&local_150,
               builder.content.ptr + 3);
  }
  _kjCondition.result = builder.content.ptr[0x10] == '\0';
  _kjCondition._0_8_ = _kjCondition._1_8_ << 8;
  _kjCondition.right = (unsigned_long)(builder.content.ptr + 0x10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_150 = (char *)((ulong)local_150 & 0xffffffffffffff00);
    kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<char,char&>&,char,char&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x46a,ERROR,
               "\"failed: expected \" \"(\'\\\\0\') == (builder[16])\", _kjCondition, \'\\0\', builder[16]"
               ,(char (*) [41])"failed: expected (\'\\0\') == (builder[16])",
               (DebugComparison<char,_char_&> *)&_kjCondition,(char *)&local_150,
               builder.content.ptr + 0x10);
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, TruncateText) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<Text>(17);
  auto builder = orphan.get();
  memset(builder.begin(), 'a', builder.size());

  EXPECT_EQ(4, message.getSegmentsForOutput()[0].size());
  orphan.truncate(2);
  EXPECT_EQ(2, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(2, reader.size());
  EXPECT_EQ(builder.begin(), reader.begin());

  EXPECT_EQ('a', builder[0]);
  EXPECT_EQ('a', builder[1]);
  EXPECT_EQ('\0', builder[2]);
  EXPECT_EQ('\0', builder[3]);
  EXPECT_EQ('\0', builder[16]);
}